

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O2

RK_S32 __thiscall MppMemService::chk_poison(MppMemService *this,MppMemNode *node)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  RK_S32 RVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  
  RVar5 = 0;
  if ((this->debug & 0x20) != 0) {
    uVar1 = (uint)node->size;
    RVar5 = 0;
    if ((int)uVar1 < 0x400) {
      uVar3 = 0;
      uVar2 = 0;
      if (0 < (int)uVar1) {
        uVar2 = (ulong)uVar1;
      }
      uVar8 = 0xffffffffffffffff;
      uVar6 = 0xffffffff;
      while (uVar7 = (uint)uVar8, uVar2 != uVar3) {
        uVar4 = (uint)uVar3;
        if (-1 < (int)uVar7) {
          uVar4 = uVar7;
        }
        bVar9 = *(char *)((long)node->ptr + uVar3) != -0x23;
        uVar8 = uVar8 & 0xffffffff;
        if (bVar9) {
          uVar8 = (ulong)uVar4;
        }
        uVar3 = uVar3 + 1;
        if (bVar9) {
          uVar6 = uVar3 & 0xffffffff;
        }
      }
      if ((-1 < (int)uVar7) || (-1 < (int)uVar6)) {
        _mpp_log_l(2,"mpp_mem","found memory %p size %d caller %s overwrite from %d to %d\n",
                   "chk_poison",node->ptr,(ulong)uVar1,node->caller,uVar8,uVar6);
        dump(this,node->caller);
      }
      RVar5 = (int)uVar6 - uVar7;
    }
  }
  return RVar5;
}

Assistant:

RK_S32 MppMemService::chk_poison(MppMemNode *node)
{
    if ((debug & MEM_POISON) == 0)
        return 0;

    // check oldest memory and free it
    RK_U8 *node_ptr = (RK_U8 *)node->ptr;
    RK_S32 size = node->size;
    RK_S32 i = 0;
    RK_S32 start = -1;
    RK_S32 end = -1;

    if (size >= 1024)
        return 0;

    for (; i < size; i++) {
        if (node_ptr[i] != MEM_CHECK_MARK) {
            if (start < 0) {
                start = i;
            }
            end = i + 1;
        }
    }

    if (start >= 0 || end >= 0) {
        mpp_err_f("found memory %p size %d caller %s overwrite from %d to %d\n",
                  node_ptr, size, node->caller, start, end);
        dump(node->caller);
    }

    return end - start;
}